

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O0

void Fraig_NodeVecSortByLevel(Fraig_NodeVec_t *p,int fIncreasing)

{
  int fIncreasing_local;
  Fraig_NodeVec_t *p_local;
  
  if (fIncreasing == 0) {
    qsort(p->pArray,(long)p->nSize,8,Fraig_NodeVecCompareLevelsDecreasing);
  }
  else {
    qsort(p->pArray,(long)p->nSize,8,Fraig_NodeVecCompareLevelsIncreasing);
  }
  return;
}

Assistant:

void Fraig_NodeVecSortByLevel( Fraig_NodeVec_t * p, int fIncreasing )
{
    if ( fIncreasing )
        qsort( (void *)p->pArray, p->nSize, sizeof(Fraig_Node_t *), 
                (int (*)(const void *, const void *)) Fraig_NodeVecCompareLevelsIncreasing );
    else 
        qsort( (void *)p->pArray, p->nSize, sizeof(Fraig_Node_t *), 
                (int (*)(const void *, const void *)) Fraig_NodeVecCompareLevelsDecreasing );
}